

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

bool __thiscall FBX::Decoder::readNode(Decoder *this,Node *node)

{
  Stream *this_00;
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  char *pcVar4;
  pointer __s2;
  int iVar5;
  size_t sVar6;
  runtime_error *this_01;
  size_t sVar7;
  size_t __n;
  ulong uVar8;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *this_02;
  long lVar9;
  Node child;
  allocator_type local_a1;
  ulong local_a0;
  undefined1 local_98 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_68;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  vStack_50;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  *local_38;
  
  pcVar4 = (this->stream).data;
  sVar6 = (this->stream).cursor;
  if (this->isuInt32 == true) {
    (this->stream).cursor = sVar6 + 4;
    local_a0 = (ulong)*(int *)(pcVar4 + sVar6);
    if (local_a0 == 0) {
      return false;
    }
    node->propertyCount = (long)*(int *)(pcVar4 + sVar6 + 4);
    sVar7 = sVar6 + 0xc;
    (this->stream).cursor = sVar7;
    iVar5 = *(int *)(pcVar4 + sVar6 + 8);
  }
  else {
    (this->stream).cursor = sVar6 + 8;
    if (*(int *)(pcVar4 + sVar6) == 0) {
      return false;
    }
    local_a0 = (ulong)*(int *)(pcVar4 + sVar6);
    (this->stream).cursor = sVar6 + 0x10;
    node->propertyCount = (long)*(int *)(pcVar4 + sVar6 + 8);
    sVar7 = sVar6 + 0x18;
    (this->stream).cursor = sVar7;
    iVar5 = *(int *)(pcVar4 + sVar6 + 0x10);
  }
  node->propertyLength = (long)iVar5;
  (this->stream).cursor = sVar7 + 1;
  pbVar1 = (byte *)(pcVar4 + sVar7);
  bVar2 = *pbVar1;
  (this->stream).cursor = sVar7 + 1 + (ulong)bVar2;
  local_98._0_8_ = local_98 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,pbVar1 + 1,pbVar1 + 1 + bVar2);
  std::__cxx11::string::operator=((string *)&node->id,(string *)local_98);
  if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
    operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
  }
  this_02 = &node->properties;
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::resize(this_02,node->propertyCount);
  if (node->propertyCount != 0) {
    lVar9 = 0;
    uVar8 = 0;
    local_38 = this_02;
    do {
      pcVar4 = (this->stream).data;
      sVar6 = (this->stream).cursor;
      (this->stream).cursor = sVar6 + 1;
      cVar3 = pcVar4[sVar6];
      switch(cVar3) {
      case 'C':
        (this->stream).cursor = sVar6 + 2;
        local_98[0] = pcVar4[sVar6 + 1];
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_02->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),(bool *)local_98);
        break;
      case 'D':
        (this->stream).cursor = sVar6 + 9;
        local_98._0_8_ = *(undefined8 *)(pcVar4 + sVar6 + 1);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_02->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),(double *)local_98);
        break;
      case 'E':
      case 'G':
      case 'H':
      case 'J':
      case 'K':
      case 'M':
      case 'N':
      case 'O':
      case 'P':
      case 'Q':
        break;
      case 'F':
        (this->stream).cursor = sVar6 + 5;
        local_98._0_4_ = *(undefined4 *)(pcVar4 + sVar6 + 1);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_02->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),(float *)local_98);
        break;
      case 'I':
        (this->stream).cursor = sVar6 + 5;
        local_98._0_4_ = *(undefined4 *)(pcVar4 + sVar6 + 1);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_02->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),(int *)local_98);
        break;
      case 'L':
        (this->stream).cursor = sVar6 + 9;
        local_98._0_8_ = *(undefined8 *)(pcVar4 + sVar6 + 1);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_02->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),(long *)local_98);
        break;
      case 'R':
        if (this->isuInt32 == true) {
          sVar7 = sVar6 + 5;
        }
        else {
          sVar7 = sVar6 + 9;
        }
        (this->stream).cursor = sVar7;
        iVar5 = *(int *)(pcVar4 + sVar6 + 1);
        (this->stream).cursor = sVar7 + (long)iVar5;
        std::vector<char,std::allocator<char>>::vector<char_const*,void>
                  ((vector<char,std::allocator<char>> *)local_98,pcVar4 + sVar7,
                   pcVar4 + sVar7 + iVar5,&local_a1);
LAB_00104ac9:
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((this_02->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),(vector<char,_std::allocator<char>_> *)local_98);
        goto LAB_00104ad8;
      case 'S':
        if (this->isuInt32 == true) {
          sVar7 = sVar6 + 5;
        }
        else {
          sVar7 = sVar6 + 9;
        }
        (this->stream).cursor = sVar7;
        iVar5 = *(int *)(pcVar4 + sVar6 + 1);
        (this->stream).cursor = sVar7 + (long)iVar5;
        local_98._0_8_ = local_98 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_98,pcVar4 + sVar7,pcVar4 + sVar7 + iVar5);
        std::
        variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
        ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     *)((long)&(((local_38->
                                 super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start)->
                               super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                               ).
                               super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                               .
                               super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                       + lVar9),
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
        this_02 = local_38;
        if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
          this_02 = local_38;
        }
        break;
      default:
        switch(cVar3) {
        case 'b':
        case 'c':
          readArray<char>((vector<char,_std::allocator<char>_> *)local_98,this);
          goto LAB_00104ac9;
        case 'd':
          readArray<double>((vector<double,_std::allocator<double>_> *)local_98,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar9),(vector<double,_std::allocator<double>_> *)local_98);
          break;
        case 'e':
        case 'g':
        case 'h':
        case 'j':
        case 'k':
          goto switchD_00104878_caseD_45;
        case 'f':
          readArray<float>((vector<float,_std::allocator<float>_> *)local_98,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar9),(vector<float,_std::allocator<float>_> *)local_98);
          break;
        case 'i':
          readArray<int>((vector<int,_std::allocator<int>_> *)local_98,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar9),(vector<int,_std::allocator<int>_> *)local_98);
          break;
        case 'l':
          readArray<long>((vector<long,_std::allocator<long>_> *)local_98,this);
          std::
          variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
          ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                       *)((long)&(((this_02->
                                   super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start)->
                                 super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                 ).
                                 super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                 .
                                 super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                         + lVar9),(vector<long,_std::allocator<long>_> *)local_98);
          break;
        default:
          if (cVar3 == 'Y') {
            (this->stream).cursor = sVar6 + 3;
            local_98._0_2_ = *(undefined2 *)(pcVar4 + sVar6 + 1);
            std::
            variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
            ::operator=((variant<short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         *)((long)&(((this_02->
                                     super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->
                                   super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                   ).
                                   super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                   .
                                   super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                           + lVar9),(short *)local_98);
          }
          goto switchD_00104878_caseD_45;
        }
LAB_00104ad8:
        if ((pointer)local_98._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_98._0_8_,local_98._16_8_ - local_98._0_8_);
        }
      }
switchD_00104878_caseD_45:
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x30;
    } while (uVar8 < node->propertyCount);
  }
  this_00 = &this->stream;
  sVar6 = Stream::tell(this_00);
  if (sVar6 < local_a0) {
    sVar6 = Stream::tell(this_00);
    __n = this->blockLength;
    if (sVar6 < local_a0 - __n) {
      do {
        local_98._0_8_ = (pointer)0x0;
        local_98._8_8_ = 0;
        local_98._24_8_ = 0;
        local_78._M_local_buf[0] = '\0';
        vStack_50.
        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        vStack_50.
        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        vStack_50.
        super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_68.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_98._16_8_ = &local_78;
        readNode(this,(Node *)local_98);
        std::vector<FBX::Node,_std::allocator<FBX::Node>_>::push_back
                  (&node->children,(Node *)local_98);
        std::
        vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
        ::~vector(&vStack_50);
        std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._16_8_ != &local_78) {
          operator_delete((void *)local_98._16_8_,
                          CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]) +
                          1);
        }
        sVar6 = Stream::tell(this_00);
        __n = this->blockLength;
      } while (sVar6 < local_a0 - __n);
    }
    sVar6 = (this->stream).cursor;
    __s2 = (this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
    (this->stream).cursor = sVar6 + __n;
    if ((__n != (long)(this->blockData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)__s2) ||
       ((__n != 0 && (iVar5 = bcmp((this->stream).data + sVar6,__s2,__n), iVar5 != 0)))) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_01,"Failed to read nested block");
      goto LAB_00104c5d;
    }
  }
  sVar6 = Stream::tell(this_00);
  if (local_a0 <= sVar6) {
    return true;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Scope length not reached");
LAB_00104c5d:
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool Decoder::readNode(Node &node) {
        size_t endOffset = readuInt();
        if (endOffset == 0)
            return false;

        node.propertyCount = readuInt();
        node.propertyLength = readuInt();

        node.id = readString();
        node.properties.resize(node.propertyCount);

        for (size_t i = 0; i < node.propertyCount; i++) {
            auto dataType = stream.read<char>();
            switch (dataType) {
                case 'Y':
                    node.properties[i] = stream.read<int16_t>(); /// 16 bit int
                    break;
                case 'C':
                    node.properties[i] = stream.read<bool>(); /// 1 bit bool
                    break;
                case 'I':
                    node.properties[i] = stream.read<int32_t>(); /// 32 bit int
                    break;
                case 'F':
                    node.properties[i] = stream.read<float>(); /// 32 bit float
                    break;
                case 'D':
                    node.properties[i] = stream.read<double>(); /// 64 bit float (double)
                    break;
                case 'L':
                    node.properties[i] = stream.read<int64_t>(); /// 64 bit int
                    break;
                case 'R': {
                    const auto &data = stream.read<char>(readuInt());
                    node.properties[i] = std::vector<char>(data.begin, data.end); /// binary data
                    break;
                }
                case 'S': {
                    const auto &data = stream.read<char>(readuInt());
                    node.properties[i] = std::string(data.begin, data.end); /// string
                    break;
                }
                case 'f':
                    node.properties[i] = readArray<float>(); /// array of 32 bit float
                    break;
                case 'i':
                    node.properties[i] = readArray<int32_t>(); /// array of 32 bit int
                    break;
                case 'd':
                    node.properties[i] = readArray<double>(); /// array of 64 bit float (double)
                    break;
                case 'l':
                    node.properties[i] = readArray<int64_t>(); /// array of 64 bit int
                    break;
                case 'b':
                    node.properties[i] = readArray<char>(); /// array of 1 bit boolean
                    break;
                case 'c':
                    node.properties[i] = readArray<char>(); /// array of bytes
                    break;
                default:
                    break;
            }
        }

        if (stream.tell() < endOffset) {
            while (stream.tell() < (endOffset - blockLength)) {
                Node child;
                readNode(child);
                node.children.push_back(child);
            }

            if (stream.read<char>(blockLength) != Span<char>(blockData.data(), blockData.size()))
                throw std::runtime_error("Failed to read nested block");
        }

        if (stream.tell() < endOffset)
            throw std::runtime_error("Scope length not reached");

        return true;
    }